

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_distefano_1999.h
# Opt level: O2

void __thiscall DiStefano::PerformLabeling(DiStefano *this)

{
  uint *puVar1;
  int *piVar2;
  undefined8 uVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  long lVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  int y;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int x_1;
  long lVar15;
  long lVar16;
  long lVar17;
  int x;
  long lVar18;
  uint uVar19;
  long lVar20;
  undefined1 uVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int *piVar25;
  ulong uVar26;
  Size local_98;
  Mat local_90 [96];
  
  uVar3 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_98.height = (int)uVar3;
  local_98.width = (int)((ulong)uVar3 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar23 = *(int *)&pMVar4->field_0x8;
  iVar12 = *(int *)&pMVar4->field_0xc;
  lVar6 = (long)((iVar12 + 1) / 2) * (long)((iVar23 + 1) / 2);
  uVar13 = lVar6 + 1;
  uVar14 = -(ulong)(uVar13 >> 0x3e != 0) | lVar6 * 4 + 4U;
  pvVar7 = operator_new__(uVar14);
  pvVar8 = operator_new__(uVar13);
  pvVar9 = operator_new__(uVar14);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar6 = 0;
  uVar10 = 0;
  do {
    if (iVar23 <= lVar6) {
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
      uVar14 = 0;
      uVar13 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar13 = uVar14;
      }
      for (uVar26 = 1; uVar26 - uVar13 != 1; uVar26 = uVar26 + 1) {
        if (uVar26 == *(uint *)((long)pvVar7 + uVar26 * 4)) {
          uVar10 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar10;
          (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
          *(uint *)((long)pvVar9 + uVar26 * 4) = uVar10;
        }
      }
      for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
        *(undefined4 *)((long)pvVar7 + uVar14 * 4 + 4) =
             *(undefined4 *)((long)pvVar9 + (long)*(int *)((long)pvVar7 + uVar14 * 4 + 4) * 4);
      }
      for (lVar6 = 0; lVar6 < *(int *)&pMVar5->field_0x8; lVar6 = lVar6 + 1) {
        lVar11 = **(long **)&pMVar5->field_0x48 * lVar6 + *(long *)&pMVar5->field_0x10;
        for (lVar16 = 0; lVar16 < *(int *)&pMVar5->field_0xc; lVar16 = lVar16 + 1) {
          lVar15 = (long)*(int *)(lVar11 + lVar16 * 4);
          if (0 < lVar15) {
            *(undefined4 *)(lVar11 + lVar16 * 4) = *(undefined4 *)((long)pvVar7 + lVar15 * 4);
          }
        }
      }
      puVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_;
      *puVar1 = *puVar1 + 1;
      operator_delete__(pvVar7);
      operator_delete__(pvVar8);
      operator_delete__(pvVar9);
      return;
    }
    lVar11 = **(long **)&pMVar4->field_0x48;
    lVar16 = *(long *)&pMVar4->field_0x10;
    lVar15 = **(long **)&pMVar5->field_0x48 * lVar6 + *(long *)&pMVar5->field_0x10;
    lVar17 = lVar15 - **(long **)&pMVar5->field_0x48;
    for (lVar18 = 0; lVar18 < iVar12; lVar18 = lVar18 + 1) {
      if (*(char *)(lVar11 * lVar6 + lVar16 + lVar18) == '\0') {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        uVar24 = 0;
        uVar19 = 0;
        uVar22 = 0;
        if (lVar6 != 0) {
          uVar22 = 0;
          if (lVar18 != 0) {
            uVar24 = *(uint *)(lVar17 + -4 + lVar18 * 4);
          }
          uVar19 = *(uint *)(lVar17 + lVar18 * 4);
          if (lVar18 < iVar12 + -1) {
            uVar22 = *(uint *)(lVar17 + 4 + lVar18 * 4);
          }
        }
        if (lVar18 != 0) {
          uVar13 = (ulong)*(uint *)(lVar15 + -4 + lVar18 * 4);
        }
        if ((((uVar24 == 0) && (uVar19 == 0)) && (uVar22 == 0)) && ((int)uVar13 == 0)) {
          lVar20 = (long)(int)uVar10;
          uVar10 = uVar10 + 1;
          *(uint *)((long)pvVar7 + lVar20 * 4 + 4) = uVar10;
          lVar20 = lVar20 + 1;
          uVar21 = 1;
          uVar24 = uVar10;
LAB_0017cea1:
          *(undefined1 *)((long)pvVar8 + lVar20) = uVar21;
        }
        else {
          if (uVar24 != 0) {
            uVar19 = uVar24;
          }
          uVar24 = uVar22;
          if ((int)uVar19 < 1) {
LAB_0017cef6:
            if ((int)uVar24 < 1) goto LAB_0017cf3d;
          }
          else {
            uVar24 = uVar19;
            if (0 < (int)uVar22) {
              iVar23 = *(int *)((long)pvVar7 + (ulong)uVar19 * 4);
              iVar12 = *(int *)((long)pvVar7 + (ulong)uVar22 * 4);
              if (iVar23 != iVar12) {
                piVar25 = (int *)((long)pvVar7 + (ulong)uVar19 * 4);
                piVar2 = (int *)((long)pvVar7 + (ulong)uVar22 * 4);
                if (*(char *)((long)pvVar8 + (long)iVar23) == '\x01') {
                  *piVar25 = iVar12;
                  piVar25 = piVar2;
                }
                else {
                  if (*(char *)((long)pvVar8 + (long)iVar12) == '\0') {
                    uVar14 = 0;
                    if (0 < (int)uVar10) {
                      uVar14 = (ulong)uVar10;
                    }
                    for (uVar26 = 0; uVar14 != uVar26; uVar26 = uVar26 + 1) {
                      if (*(int *)((long)pvVar7 + uVar26 * 4 + 4) == iVar12) {
                        *(int *)((long)pvVar7 + uVar26 * 4 + 4) = iVar23;
                      }
                    }
                    goto LAB_0017cef6;
                  }
                  *piVar2 = iVar23;
                }
                *(undefined1 *)((long)pvVar8 + (long)*piVar25) = 0;
              }
            }
          }
          if (0 < (int)uVar13) {
            uVar14 = (ulong)uVar24;
            iVar23 = *(int *)((long)pvVar7 + uVar14 * 4);
            iVar12 = *(int *)((long)pvVar7 + uVar13 * 4);
            if (iVar23 != iVar12) {
              if (*(char *)((long)pvVar8 + (long)iVar23) == '\x01') {
                *(int *)((long)pvVar7 + uVar14 * 4) = iVar12;
                iVar23 = *(int *)((long)pvVar7 + uVar13 * 4);
              }
              else {
                if (*(char *)((long)pvVar8 + (long)iVar12) == '\0') {
                  uVar13 = 0;
                  if (0 < (int)uVar10) {
                    uVar13 = (ulong)uVar10;
                  }
                  for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
                    if (*(int *)((long)pvVar7 + uVar14 * 4 + 4) == iVar12) {
                      *(int *)((long)pvVar7 + uVar14 * 4 + 4) = iVar23;
                    }
                  }
                  goto LAB_0017cf3a;
                }
                *(int *)((long)pvVar7 + uVar13 * 4) = iVar23;
                iVar23 = *(int *)((long)pvVar7 + uVar14 * 4);
              }
              lVar20 = (long)iVar23;
              uVar21 = 0;
              goto LAB_0017cea1;
            }
          }
        }
LAB_0017cf3a:
        uVar13 = (ulong)uVar24;
      }
LAB_0017cf3d:
      *(int *)(lVar15 + lVar18 * 4) = (int)uVar13;
      iVar12 = *(int *)&pMVar4->field_0xc;
    }
    lVar6 = lVar6 + 1;
    iVar23 = *(int *)&pMVar4->field_0x8;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size());

        int i_new_label(0);

        // p q r		  p
        // s x			q x
        // lp,lq,lx: labels assigned to p,q,x

        // First scan
        int *a_class = new int[UPPER_BOUND_8_CONNECTIVITY];
        bool *a_single = new bool[UPPER_BOUND_8_CONNECTIVITY];
        int *a_renum = new int[UPPER_BOUND_8_CONNECTIVITY];

        for (int y = 0; y < img_.rows; y++) {

            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int x = 0; x < img_.cols; x++) {
                if (img_row[x]) {

                    int lp(0), lq(0), lr(0), ls(0), lx(0); // lMin(INT_MAX);
                    if (y > 0) {
                        if (x > 0)
                            lp = img_labels_row_prev[x - 1];
                        lq = img_labels_row_prev[x];
                        if (x < img_.cols - 1)
                            lr = img_labels_row_prev[x + 1];
                    }
                    if (x > 0)
                        ls = img_labels_row[x - 1];

                    // If everything around is background
                    if (lp == 0 && lq == 0 && lr == 0 && ls == 0) {
                        lx = ++i_new_label;
                        a_class[lx] = lx;
                        a_single[lx] = true;
                    }
                    else {
                        // p
                        lx = lp;
                        // q
                        if (lx == 0)
                            lx = lq;
                        // r
                        if (lx > 0) {
                            if (lr > 0 && a_class[lx] != a_class[lr]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[lr];
                                    a_single[a_class[lr]] = false;
                                }
                                else if (a_single[a_class[lr]]) {
                                    a_class[lr] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[lr];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = lr;
                        // s
                        if (lx > 0) {
                            if (ls > 0 && a_class[lx] != a_class[ls]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[ls];
                                    a_single[a_class[ls]] = false;
                                }
                                else if (a_single[a_class[ls]]) {
                                    a_class[ls] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[ls];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = ls;
                    }

                    img_labels_row[x] = lx;
                }
                else
                    img_labels_row[x] = 0;
            }
        }

        // Renumbering of labels
        n_labels_ = 0;
        for (int k = 1; k <= i_new_label; k++) {
            if (a_class[k] == k) {
                n_labels_++;
                a_renum[k] = n_labels_;
            }
        }
        for (int k = 1; k <= i_new_label; k++)
            a_class[k] = a_renum[a_class[k]];

        // Second scan
        for (int y = 0; y < img_labels_.rows; y++) {

            // Get rows pointer
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

            for (int x = 0; x < img_labels_.cols; x++) {
                int iLabel = img_labels_row[x];
                if (iLabel > 0)
                    img_labels_row[x] = a_class[iLabel];
            }
        }

        n_labels_++; // To count also background

        delete[] a_class;
        delete[] a_single;
        delete[] a_renum;
    }